

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

void lws_filename_purify_inplace(char *filename)

{
  uint uVar1;
  byte *pbVar2;
  
  do {
    uVar1 = (byte)*filename - 0x24;
    if (uVar1 < 0x39) {
      pbVar2 = (byte *)filename;
      if ((0x100000000400003U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        if ((ulong)uVar1 != 10) goto LAB_00103b70;
        if (((byte *)filename)[1] == 0x2e) {
          pbVar2 = (byte *)filename + 1;
          *filename = 0x5f;
          goto LAB_00103b53;
        }
      }
      else {
LAB_00103b53:
        *pbVar2 = 0x5f;
      }
    }
    else {
LAB_00103b70:
      if (*filename == 0) {
        return;
      }
    }
    filename = (char *)((byte *)filename + 1);
  } while( true );
}

Assistant:

void
lws_filename_purify_inplace(char *filename)
{
	while (*filename) {

		if (*filename == '.' && filename[1] == '.') {
			*filename = '_';
			filename[1] = '_';
		}

		if (*filename == ':' ||
		    *filename == '\\' ||
		    *filename == '$' ||
		    *filename == '%')
			*filename = '_';

		filename++;
	}
}